

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

TimeZoneRule *
icu_63::createRuleByRDATE
          (UnicodeString *zonename,int32_t rawOffset,int32_t dstSavings,UDate start,UVector *dates,
          int32_t fromOffset,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  TimeArrayTimeZoneRule *pTVar3;
  UDate *startTimes;
  UnicodeString *str;
  undefined4 in_register_00000034;
  size_t size_00;
  UDate UVar4;
  TimeArrayTimeZoneRule *local_a8;
  TimeArrayTimeZoneRule *local_98;
  UnicodeString *datestr;
  int32_t i;
  UDate *times;
  int32_t size;
  TimeArrayTimeZoneRule *local_48;
  TimeArrayTimeZoneRule *retVal;
  UErrorCode *status_local;
  int32_t fromOffset_local;
  UVector *dates_local;
  UDate start_local;
  int32_t dstSavings_local;
  int32_t rawOffset_local;
  UnicodeString *zonename_local;
  
  size_00 = CONCAT44(in_register_00000034,rawOffset);
  dates_local = (UVector *)start;
  start_local._0_4_ = dstSavings;
  start_local._4_4_ = rawOffset;
  _dstSavings_local = zonename;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 != '\0') {
    return (TimeZoneRule *)0x0;
  }
  if ((dates == (UVector *)0x0) || (iVar2 = UVector::size(dates), iVar2 == 0)) {
    pTVar3 = (TimeArrayTimeZoneRule *)UMemory::operator_new((UMemory *)0x160,size_00);
    local_98 = (TimeArrayTimeZoneRule *)0x0;
    if (pTVar3 != (TimeArrayTimeZoneRule *)0x0) {
      TimeArrayTimeZoneRule::TimeArrayTimeZoneRule
                (pTVar3,_dstSavings_local,start_local._4_4_,start_local._0_4_,(UDate *)&dates_local,
                 1,UTC_TIME);
      local_98 = pTVar3;
    }
    local_48 = local_98;
  }
  else {
    iVar2 = UVector::size(dates);
    startTimes = (UDate *)uprv_malloc_63((long)iVar2 << 3);
    if (startTimes == (UDate *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      return (TimeZoneRule *)0x0;
    }
    for (datestr._4_4_ = 0; datestr._4_4_ < iVar2; datestr._4_4_ = datestr._4_4_ + 1) {
      str = (UnicodeString *)UVector::elementAt(dates,datestr._4_4_);
      size_00 = (size_t)(uint)fromOffset;
      UVar4 = parseDateTimeString(str,fromOffset,status);
      startTimes[datestr._4_4_] = UVar4;
      UVar1 = ::U_FAILURE(*status);
      if (UVar1 != '\0') {
        uprv_free_63(startTimes);
        return (TimeZoneRule *)0x0;
      }
    }
    pTVar3 = (TimeArrayTimeZoneRule *)UMemory::operator_new((UMemory *)0x160,size_00);
    local_a8 = (TimeArrayTimeZoneRule *)0x0;
    if (pTVar3 != (TimeArrayTimeZoneRule *)0x0) {
      TimeArrayTimeZoneRule::TimeArrayTimeZoneRule
                (pTVar3,_dstSavings_local,start_local._4_4_,start_local._0_4_,startTimes,iVar2,
                 UTC_TIME);
      local_a8 = pTVar3;
    }
    local_48 = local_a8;
    uprv_free_63(startTimes);
  }
  return &local_48->super_TimeZoneRule;
}

Assistant:

static TimeZoneRule* createRuleByRDATE(const UnicodeString& zonename, int32_t rawOffset, int32_t dstSavings,
                                       UDate start, UVector* dates, int32_t fromOffset, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return NULL;
    }
    TimeArrayTimeZoneRule *retVal = NULL;
    if (dates == NULL || dates->size() == 0) {
        // When no RDATE line is provided, use start (DTSTART)
        // as the transition time
        retVal = new TimeArrayTimeZoneRule(zonename, rawOffset, dstSavings,
            &start, 1, DateTimeRule::UTC_TIME);
    } else {
        // Create an array of transition times
        int32_t size = dates->size();
        UDate* times = (UDate*)uprv_malloc(sizeof(UDate) * size);
        if (times == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return NULL;
        }
        for (int32_t i = 0; i < size; i++) {
            UnicodeString *datestr = (UnicodeString*)dates->elementAt(i);
            times[i] = parseDateTimeString(*datestr, fromOffset, status);
            if (U_FAILURE(status)) {
                uprv_free(times);
                return NULL;
            }
        }
        retVal = new TimeArrayTimeZoneRule(zonename, rawOffset, dstSavings,
            times, size, DateTimeRule::UTC_TIME);
        uprv_free(times);
    }
    return retVal;
}